

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  _Base_ptr p_Var8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  bool SRArgumentSpecified;
  string errormsg;
  string arg;
  string targ;
  bool local_231;
  size_t local_230;
  uint local_224;
  uint local_220;
  uint local_21c;
  string local_218;
  long *local_1f8 [2];
  long local_1e8 [2];
  string *local_1d8;
  string *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_231 = false;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->InitialCommandLineArguments,
             (this->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  local_230 = 1;
  uVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  bVar11 = uVar7 >= 0x21;
  if (uVar7 < 0x21) {
    uVar9 = 1;
    uVar10 = 0;
  }
  else {
    local_1d0 = &this->ScheduleType;
    local_224 = (uint)CONCAT71((int7)((ulong)local_1d0 >> 8),1);
    local_220 = 0;
    local_1d8 = output;
    do {
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
      bVar3 = HandleCommandLineArguments(this,&local_230,args,&local_218);
      if (bVar3) {
        HandleScriptArguments(this,&local_230,args,&local_231);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1f8[0] = local_1e8;
        pcVar2 = pbVar1[local_230]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,pcVar2,pcVar2 + pbVar1[local_230]._M_string_length);
        iVar5 = std::__cxx11::string::compare((char *)local_1f8);
        if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)local_1f8), iVar5 == 0))
           && (pbVar1 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,
              local_230 <
              ((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U)) {
          this->ProduceXML = true;
          local_230 = local_230 + 1;
          local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          pcVar2 = pbVar1[local_230]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar2,pcVar2 + pbVar1[local_230]._M_string_length);
          bVar3 = AddTestsForDashboardType(this,local_1a8);
          if ((!bVar3) && (bVar3 = AddVariableDefinition(this,local_1a8), !bVar3)) {
            ErrorMessageUnknownDashDValue(this,local_1a8);
            local_224 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                     local_1a8[0].field_2._M_local_buf[0]) + 1);
          }
        }
        iVar5 = std::__cxx11::string::compare((char *)local_1f8);
        if ((iVar5 != 0) &&
           (bVar3 = cmsys::SystemTools::StringStartsWith((char *)local_1f8[0],"-D"), bVar3)) {
          std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_1f8);
          AddVariableDefinition(this,local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                     local_1a8[0].field_2._M_local_buf[0]) + 1);
          }
        }
        bVar3 = HandleTestActionArgument(this,"ctest",&local_230,args);
        bVar4 = HandleTestModelArgument(this,"ctest",&local_230,args);
        local_224 = local_224 & 0xff;
        if (!bVar4) {
          local_224 = 0;
        }
        if (!bVar3) {
          local_224 = 0;
        }
        iVar5 = std::__cxx11::string::compare((char *)local_1f8);
        if ((iVar5 == 0) &&
           (local_230 <
            ((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          this->ProduceXML = true;
          SetTest(this,"Submit",true);
          local_230 = local_230 + 1;
          bVar4 = SubmitExtraFiles(this,(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start[local_230].
                                        _M_dataplus._M_p);
          bVar3 = false;
          if (bVar4) goto LAB_0028d097;
LAB_0028d1f7:
          local_21c = 0;
        }
        else {
LAB_0028d097:
          iVar5 = std::__cxx11::string::compare((char *)local_1f8);
          if ((iVar5 == 0) &&
             (local_220 = local_220 & 0xff,
             local_230 <
             ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
            local_220 = 1;
          }
          iVar5 = std::__cxx11::string::compare((char *)local_1f8);
          if (iVar5 == 0) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_1d0,0,(char *)(this->ScheduleType)._M_string_length,0x635c32);
          }
          for (p_Var8 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
              ; bVar3 = (_Rb_tree_header *)p_Var8 ==
                        &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header, !bVar3;
              p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
            iVar5 = (**(code **)(**(long **)(p_Var8 + 2) + 0x10))
                              (*(long **)(p_Var8 + 2),(string *)local_1f8,&local_230,args);
            if (iVar5 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Problem parsing command line arguments within a handler",0x37);
              std::__cxx11::stringbuf::str();
              Log(this,6,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                  ,0x840,(char *)local_1c8,false);
              if (local_1c8 != local_1b8) {
                operator_delete(local_1c8,local_1b8[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_0028d1f7;
            }
          }
        }
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0],local_1e8[0] + 1);
        }
      }
      else {
        bVar3 = false;
        cmSystemTools::Error(local_218._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
        local_21c = 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar3) break;
      local_230 = local_230 + 1;
      bVar11 = local_230 <
               (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 5);
    } while (bVar11);
    uVar7 = (ulong)local_21c;
    output = local_1d8;
    uVar10 = local_220;
    uVar9 = local_224;
  }
  iVar5 = (int)uVar7;
  if (!bVar11) {
    if (this->ParallelLevelSetInCli == false) {
      local_1a8[0]._M_string_length = 0;
      local_1a8[0].field_2._M_local_buf[0] = '\0';
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      bVar11 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",local_1a8);
      if (bVar11) {
        iVar6 = atoi(local_1a8[0]._M_dataplus._M_p);
        iVar5 = 1;
        if (1 < iVar6) {
          iVar5 = iVar6;
        }
        this->ParallelLevel = iVar5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,
                        CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                                 local_1a8[0].field_2._M_local_buf[0]) + 1);
      }
    }
    if ((uVar10 & 1) == 0) {
      iVar5 = 1;
      if ((uVar9 & 1) != 0) {
        iVar5 = ExecuteTests(this);
      }
    }
    else {
      iVar5 = RunCMakeAndTest(this,output);
    }
  }
  return iVar5;
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  this->InitialCommandLineArguments.insert(
    this->InitialCommandLineArguments.end(), args.begin(), args.end());

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg.c_str());
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D", "--dashboard") && i < args.size() - 1) {
      this->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmSystemTools::StringStartsWith(arg.c_str(), "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit") && i < args.size() - 1) {
      this->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i].c_str())) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test") && i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random")) {
      this->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but i may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    cmCTest::t_TestingHandlers::iterator it;
    for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
         ++it) {
      if (!it->second->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}